

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void __thiscall
gflags::anon_unknown_2::CommandLineFlag::FillCommandLineFlagInfo
          (CommandLineFlag *this,CommandLineFlagInfo *result)

{
  char *pcVar1;
  ValidateFnProto p_Var2;
  void *pvVar3;
  CommandLineFlag local_58 [32];
  CommandLineFlag local_38 [32];
  CommandLineFlagInfo *local_18;
  CommandLineFlagInfo *result_local;
  CommandLineFlag *this_local;
  
  local_18 = result;
  result_local = (CommandLineFlagInfo *)this;
  pcVar1 = name(this);
  std::__cxx11::string::operator=((string *)local_18,pcVar1);
  pcVar1 = type_name(this);
  std::__cxx11::string::operator=((string *)&local_18->type,pcVar1);
  pcVar1 = help(this);
  std::__cxx11::string::operator=((string *)&local_18->description,pcVar1);
  (anonymous_namespace)::CommandLineFlag::current_value_abi_cxx11_(local_38);
  std::__cxx11::string::operator=((string *)&local_18->current_value,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  (anonymous_namespace)::CommandLineFlag::default_value_abi_cxx11_(local_58);
  std::__cxx11::string::operator=((string *)&local_18->default_value,(string *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  pcVar1 = CleanFileName(this);
  std::__cxx11::string::operator=((string *)&local_18->filename,pcVar1);
  UpdateModifiedBit(this);
  local_18->is_default = (bool)((this->modified_ ^ 0xffU) & 1);
  p_Var2 = validate_function(this);
  local_18->has_validator_fn = p_Var2 != (ValidateFnProto)0x0;
  pvVar3 = flag_ptr(this);
  local_18->flag_ptr = pvVar3;
  return;
}

Assistant:

void CommandLineFlag::FillCommandLineFlagInfo(
    CommandLineFlagInfo* result) {
  result->name = name();
  result->type = type_name();
  result->description = help();
  result->current_value = current_value();
  result->default_value = default_value();
  result->filename = CleanFileName();
  UpdateModifiedBit();
  result->is_default = !modified_;
  result->has_validator_fn = validate_function() != NULL;
  result->flag_ptr = flag_ptr();
}